

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall
testing::internal::Arguments::AddArguments<std::__cxx11::string>
          (Arguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  char *src;
  char *local_48;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_40;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_38;
  const_iterator local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  Arguments *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arguments;
  local_20._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(arguments);
  while( true ) {
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    local_40._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->args_);
    local_38 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
               ::operator-(&local_40,1);
    __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
    __normal_iterator<char**>
              ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_30,
               &local_38);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_20);
    src = (char *)std::__cxx11::string::c_str();
    local_48 = posix::StrDup(src);
    std::vector<char_*,_std::allocator<char_*>_>::insert(&this->args_,local_30,&local_48);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void AddArguments(const ::std::vector<Str>& arguments) {
    for (typename ::std::vector<Str>::const_iterator i = arguments.begin();
         i != arguments.end(); ++i) {
      args_.insert(args_.end() - 1, posix::StrDup(i->c_str()));
    }
  }